

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O1

NameIndex * __thiscall
llvm::DWARFDebugNames::getCUNameIndex(DWARFDebugNames *this,uint64_t CUOffset)

{
  bool bVar1;
  ulong uVar2;
  NameIndex *pNVar3;
  uint32_t CU;
  pointer local_68;
  DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*> *TheBucket;
  uint64_t local_50;
  uint64_t CUOffset_local;
  NameIndex *local_40;
  NameIndex *local_38;
  
  local_50 = CUOffset;
  if ((((this->CUToNameIndex).NumEntries == 0) &&
      ((this->NameIndices).super_SmallVectorImpl<llvm::DWARFDebugNames::NameIndex>.
       super_SmallVectorTemplateBase<llvm::DWARFDebugNames::NameIndex,_false>.
       super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>.super_SmallVectorBase
       .Size != 0)) &&
     (uVar2 = (ulong)(this->NameIndices).super_SmallVectorImpl<llvm::DWARFDebugNames::NameIndex>.
                     super_SmallVectorTemplateBase<llvm::DWARFDebugNames::NameIndex,_false>.
                     super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>.
                     super_SmallVectorBase.Size, uVar2 != 0)) {
    pNVar3 = (NameIndex *)
             (this->NameIndices).super_SmallVectorImpl<llvm::DWARFDebugNames::NameIndex>.
             super_SmallVectorTemplateBase<llvm::DWARFDebugNames::NameIndex,_false>.
             super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>.
             super_SmallVectorBase.BeginX;
    local_38 = pNVar3 + uVar2;
    do {
      if ((pNVar3->Hdr).super_HeaderPOD.CompUnitCount != 0) {
        CU = 0;
        do {
          CUOffset_local = NameIndex::getCUOffset(pNVar3,CU);
          local_40 = pNVar3;
          DenseMapBase<llvm::DenseMap<unsigned_long,llvm::DWARFDebugNames::NameIndex_const*,llvm::DenseMapInfo<unsigned_long>,llvm::detail::DenseMapPair<unsigned_long,llvm::DWARFDebugNames::NameIndex_const*>>,unsigned_long,llvm::DWARFDebugNames::NameIndex_const*,llvm::DenseMapInfo<unsigned_long>,llvm::detail::DenseMapPair<unsigned_long,llvm::DWARFDebugNames::NameIndex_const*>>
          ::try_emplace<llvm::DWARFDebugNames::NameIndex_const*>
                    ((pair<llvm::DenseMapIterator<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>,_false>,_bool>
                      *)&stack0xffffffffffffff98,&this->CUToNameIndex,&CUOffset_local,&local_40);
          CU = CU + 1;
        } while (CU < (pNVar3->Hdr).super_HeaderPOD.CompUnitCount);
      }
      pNVar3 = pNVar3 + 1;
    } while (pNVar3 != local_38);
  }
  bVar1 = DenseMapBase<llvm::DenseMap<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>_>,_unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>_>
          ::LookupBucketFor<unsigned_long>
                    ((DenseMapBase<llvm::DenseMap<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>_>,_unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>_>
                      *)&this->CUToNameIndex,&local_50,&stack0xffffffffffffff98);
  if (bVar1) {
    pNVar3 = (local_68->super_pair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>).second;
  }
  else {
    pNVar3 = (NameIndex *)0x0;
  }
  return pNVar3;
}

Assistant:

const DWARFDebugNames::NameIndex *
DWARFDebugNames::getCUNameIndex(uint64_t CUOffset) {
  if (CUToNameIndex.size() == 0 && NameIndices.size() > 0) {
    for (const auto &NI : *this) {
      for (uint32_t CU = 0; CU < NI.getCUCount(); ++CU)
        CUToNameIndex.try_emplace(NI.getCUOffset(CU), &NI);
    }
  }
  return CUToNameIndex.lookup(CUOffset);
}